

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O2

err_t stb99ZiVal(stb99_seed *seed)

{
  u16 *puVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x1f) {
      return 0;
    }
    puVar1 = seed->zi + lVar2;
    lVar2 = lVar2 + 1;
  } while (0x117 < (ushort)(*puVar1 + 0x117));
  return 0x20c;
}

Assistant:

static err_t stb99ZiVal(const stb99_seed* seed)
{
	size_t i;
	for (i = 0; i < 31; ++i)
		if (seed->zi[i] == 0 || seed->zi[i] >= 65257)
			return ERR_BAD_SEED;
	return ERR_OK;
}